

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall
CVmObjDict::match_strings
          (CVmObjDict *this,vm_val_t *valstrval,char *valstr,size_t vallen,char *refstr,
          size_t reflen,vm_val_t *result_val)

{
  vm_dict_comp_type vVar1;
  undefined4 uVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  vm_dict_ext *pvVar5;
  vm_val_t *pvVar6;
  size_t in_RCX;
  void *in_RDX;
  vm_val_t *in_RSI;
  CVmObjDict *in_RDI;
  void *in_R8;
  size_t in_R9;
  vm_val_t *in_stack_00000008;
  vm_rcdesc rc;
  vm_val_t cobj_val;
  char *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  bool bVar7;
  char *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff84;
  vm_val_t *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff96;
  vm_val_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa4;
  CVmRun *in_stack_ffffffffffffffa8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc0;
  uint local_4;
  
  pvVar5 = get_ext(in_RDI);
  pvVar6 = in_stack_00000008;
  vVar1 = pvVar5->comparator_type_;
  if (vVar1 == VMDICT_COMP_NONE) {
    if ((in_RCX == in_R9) && (iVar3 = memcmp(in_RDX,in_R8,in_RCX), iVar3 == 0)) {
      vm_val_t::set_int(in_stack_00000008,1);
      local_4 = 1;
    }
    else {
      vm_val_t::set_int(in_stack_00000008,0);
      local_4 = 0;
    }
  }
  else if (vVar1 == VMDICT_COMP_STRCOMP) {
    pvVar5 = get_ext(in_RDI);
    iVar3 = (*pvVar5->comparator_obj_->_vptr_CVmObject[0x3c])
                      (pvVar5->comparator_obj_,in_RDX,in_RCX,in_R8,in_R9);
    vm_val_t::set_int(pvVar6,iVar3);
    local_4 = (in_stack_00000008->val).intval;
  }
  else if (vVar1 == VMDICT_COMP_GENERIC) {
    pvVar6 = CVmStack::push();
    vVar4 = CVmObjString::create
                      ((int)((ulong)pvVar6 >> 0x20),in_stack_ffffffffffffff48,
                       CONCAT17(in_stack_ffffffffffffff47,
                                CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    vm_val_t::set_obj(pvVar6,vVar4);
    iVar3 = (int)((ulong)pvVar6 >> 0x20);
    if (in_RSI == (vm_val_t *)0x0) {
      pvVar6 = CVmStack::push();
      vVar4 = CVmObjString::create
                        (iVar3,(char *)pvVar6,
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
      vm_val_t::set_obj(pvVar6,vVar4);
    }
    else {
      CVmStack::push(in_RSI);
    }
    vm_rcdesc::vm_rcdesc((vm_rcdesc *)&stack0xffffffffffffff70);
    vm_rcdesc::init_ret((vm_rcdesc *)
                        CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                        in_stack_ffffffffffffff38);
    pvVar5 = get_ext(in_RDI);
    vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb8,pvVar5->comparator_);
    CVmRun::get_prop(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff96,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                     (vm_rcdesc *)in_stack_ffffffffffffffc0.native_desc);
    pvVar6 = CVmRun::get_r0();
    uVar2 = *(undefined4 *)&pvVar6->field_0x4;
    in_stack_00000008->typ = pvVar6->typ;
    *(undefined4 *)&in_stack_00000008->field_0x4 = uVar2;
    in_stack_00000008->val = pvVar6->val;
    bVar7 = true;
    if ((in_stack_00000008->typ != VM_NIL) && (bVar7 = false, in_stack_00000008->typ == VM_INT)) {
      bVar7 = (in_stack_00000008->val).obj == 0;
    }
    local_4 = (uint)((bVar7 ^ 0xffU) & 1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmObjDict::match_strings(VMG_ const vm_val_t *valstrval,
                              const char *valstr, size_t vallen,
                              const char *refstr, size_t reflen,
                              vm_val_t *result_val)
{
    vm_val_t cobj_val;

    /* check what kind of comparator we have */
    switch(get_ext()->comparator_type_)
    {
    case VMDICT_COMP_NONE:
        /* no comparator - compare the strings byte-for-byte */
        if (vallen == reflen && memcmp(valstr, refstr, vallen) == 0)
        {
            /* match - return true */
            result_val->set_int(1);
            return TRUE;
        }
        else
        {
            /* no match - return false */
            result_val->set_int(0);
            return FALSE;
        }

    case VMDICT_COMP_STRCOMP:
        /* match the value directly with the StringComparator */
        result_val->set_int(
            ((CVmObjStrComp *)get_ext()->comparator_obj_)->match_strings(
                valstr, vallen, refstr, reflen));
        
        /* we matched if the result was non-zero */
        return result_val->val.intval;

    case VMDICT_COMP_GENERIC:
        /* 2nd param: push the reference string, as a string object */
        G_stk->push()->set_obj(
            CVmObjString::create(vmg_ FALSE, refstr, reflen));
        
        /* 1st param: push the value string */
        if (valstrval != 0)
        {
            /* push the value string as given */
            G_stk->push(valstrval);
        }
        else
        {
            /* no value string was given - create one and push it */
            G_stk->push()->set_obj(
                CVmObjString::create(vmg_ FALSE, valstr, vallen));
        }

        {
            /* set up a recursive call context */
            vm_rcdesc rc;
            rc.init_ret(vmg_ "HashComparator.matchValues");

            /* call the comparator's matchValues method */
            cobj_val.set_obj(get_ext()->comparator_);
            G_interpreter->get_prop(vmg_ 0, &cobj_val,
                                    G_predef->match_values_prop, &cobj_val, 2,
                                    &rc);
        }

        /* get the result from R0 */
        *result_val = *G_interpreter->get_r0();

        /* we matched if the result isn't 0 or nil */
        return !(result_val->typ == VM_NIL
                 || (result_val->typ == VM_INT
                     && result_val->val.intval == 0));
    }

    /* we should never get here, but just in case... */
    return FALSE;
}